

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O1

RPCHelpMan * generate(void)

{
  string description;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffee0;
  code *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff18 [16];
  pointer pRVar2;
  pointer pRVar3;
  pointer pRVar4;
  pointer in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  long *plVar5;
  undefined1 in_stack_ffffffffffffff60;
  undefined1 uVar6;
  undefined7 in_stack_ffffffffffffff61;
  long *local_90;
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  _Any_data local_50;
  _Manager_type local_40 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._M_unused._M_object = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"generate","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,
             "has been replaced by the -generate cli option. Refer to -help for more information.",
             "");
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffff10,
             (initializer_list<RPCResult>)ZEXT816(0),(allocator_type *)&stack0xffffffffffffff4f);
  plVar5 = (long *)&stack0xffffffffffffff60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff50,"");
  local_90 = local_80;
  if (plVar5 != (long *)&stack0xffffffffffffff60) {
    local_90 = plVar5;
  }
  local_80[0] = CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60);
  uVar6 = 0;
  pcVar1 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mining.cpp:256:147)>
           ::_M_manager;
  description._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mining.cpp:256:147)>
       ::_M_invoke;
  description._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mining.cpp:256:147)>
                ::_M_manager;
  description.field_2 = in_stack_ffffffffffffff08;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffff18._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffff18._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pRVar4;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pRVar3;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffff40;
  examples.m_examples.field_2._9_7_ = in_stack_ffffffffffffff61;
  examples.m_examples._0_25_ =
       ZEXT1625(CONCAT88(&stack0xffffffffffffff60,in_stack_ffffffffffffff48));
  plVar5 = (long *)&stack0xffffffffffffff60;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffffee0,&stack0xfffffffffffffee8)),
             description,args,results,examples,(RPCMethodImpl *)&local_50);
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&stack0xfffffffffffffee8,&stack0xfffffffffffffee8,3);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (plVar5 != (long *)&stack0xffffffffffffff60) {
    operator_delete(plVar5,CONCAT71(in_stack_ffffffffffffff61,uVar6) + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffff10);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffff28);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((_Manager_type *)local_50._M_unused._0_8_ != local_40) {
    operator_delete(local_50._M_unused._M_object,(ulong)(local_40[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static RPCHelpMan generate()
{
    return RPCHelpMan{"generate", "has been replaced by the -generate cli option. Refer to -help for more information.", {}, {}, RPCExamples{""}, [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue {
        throw JSONRPCError(RPC_METHOD_NOT_FOUND, self.ToString());
    }};
}